

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

ON_MappingChannel * __thiscall
ON_ObjectRenderingAttributes::MappingChannel
          (ON_ObjectRenderingAttributes *this,ON_UUID *plugin_id,ON_UUID *mapping_id)

{
  ON_MappingRef *pOVar1;
  int iVar2;
  ON_MappingChannel *b;
  bool bVar3;
  
  pOVar1 = MappingRef(this,plugin_id);
  if ((pOVar1 != (ON_MappingRef *)0x0) && (iVar2 = (pOVar1->m_mapping_channels).m_count, 0 < iVar2))
  {
    b = (pOVar1->m_mapping_channels).m_a;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      bVar3 = ::operator==(mapping_id,&b->m_mapping_id);
      if (bVar3) {
        return b;
      }
      b = b + 1;
    }
  }
  return (ON_MappingChannel *)0x0;
}

Assistant:

const ON_MappingChannel* ON_ObjectRenderingAttributes::MappingChannel(
  const ON_UUID& plugin_id,
  const ON_UUID& mapping_id
  ) const
{
  const ON_MappingRef* mr = MappingRef(plugin_id);
  if ( mr )
  {
    int count;
    if ( (count = mr->m_mapping_channels.Count()) > 0 )
    {
      for ( const ON_MappingChannel* mc = mr->m_mapping_channels.Array(); count--; mc++ )
      {
        if ( mapping_id == mc->m_mapping_id )
          return mc;
      }
    }
  }
  return 0;
}